

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplex.cc
# Opt level: O0

ostream * fizplex::operator<<(ostream *os,IterationDecision *id)

{
  initializer_list<std::pair<const_fizplex::Simplex::IterationDecision,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  int iVar1;
  mapped_type *pmVar2;
  ostream *in_RDI;
  key_type *in_stack_fffffffffffffe38;
  unordered_map<fizplex::Simplex::IterationDecision,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<fizplex::Simplex::IterationDecision>,_std::equal_to<fizplex::Simplex::IterationDecision>,_std::allocator<std::pair<const_fizplex::Simplex::IterationDecision,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffe40;
  key_equal *in_stack_fffffffffffffe48;
  hasher *in_stack_fffffffffffffe50;
  size_type in_stack_fffffffffffffe58;
  unordered_map<fizplex::Simplex::IterationDecision,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<fizplex::Simplex::IterationDecision>,_std::equal_to<fizplex::Simplex::IterationDecision>,_std::allocator<std::pair<const_fizplex::Simplex::IterationDecision,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffe60;
  iterator in_stack_fffffffffffffe68;
  ostream *poVar3;
  pair<const_fizplex::Simplex::IterationDecision,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffe70;
  undefined8 **ppuVar4;
  allocator_type *in_stack_fffffffffffffe80;
  undefined1 local_16f [7];
  undefined4 local_168;
  undefined4 local_164;
  undefined4 local_160;
  undefined4 local_15c;
  undefined4 local_158;
  undefined4 local_144;
  undefined8 *local_140;
  undefined1 *local_138 [5];
  undefined1 local_110 [40];
  undefined1 local_e8 [40];
  undefined1 local_c0 [40];
  undefined1 local_98 [40];
  undefined1 local_70 [40];
  undefined1 local_48 [40];
  undefined8 *local_20;
  undefined8 local_18;
  ostream *local_8;
  
  local_8 = in_RDI;
  if (operator<<(std::ostream&,fizplex::Simplex::IterationDecision_const&)::idtos_abi_cxx11_ == '\0'
     ) {
    iVar1 = __cxa_guard_acquire(&operator<<(std::ostream&,fizplex::Simplex::IterationDecision_const&)
                                 ::idtos_abi_cxx11_);
    if (iVar1 != 0) {
      local_140 = local_138;
      local_144 = 0;
      std::
      pair<const_fizplex::Simplex::IterationDecision,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<fizplex::Simplex::IterationDecision,_const_char_(&)[10],_true>
                (in_stack_fffffffffffffe70,&in_stack_fffffffffffffe68->first,
                 (char (*) [10])in_stack_fffffffffffffe60);
      local_140 = (undefined8 *)local_110;
      local_158 = 1;
      std::
      pair<const_fizplex::Simplex::IterationDecision,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<fizplex::Simplex::IterationDecision,_const_char_(&)[10],_true>
                (in_stack_fffffffffffffe70,&in_stack_fffffffffffffe68->first,
                 (char (*) [10])in_stack_fffffffffffffe60);
      local_140 = (undefined8 *)local_e8;
      local_15c = 2;
      std::
      pair<const_fizplex::Simplex::IterationDecision,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<fizplex::Simplex::IterationDecision,_const_char_(&)[11],_true>
                (in_stack_fffffffffffffe70,&in_stack_fffffffffffffe68->first,
                 (char (*) [11])in_stack_fffffffffffffe60);
      local_140 = (undefined8 *)local_c0;
      local_160 = 3;
      std::
      pair<const_fizplex::Simplex::IterationDecision,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<fizplex::Simplex::IterationDecision,_const_char_(&)[16],_true>
                (in_stack_fffffffffffffe70,&in_stack_fffffffffffffe68->first,
                 (char (*) [16])in_stack_fffffffffffffe60);
      local_140 = (undefined8 *)local_98;
      local_164 = 4;
      std::
      pair<const_fizplex::Simplex::IterationDecision,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<fizplex::Simplex::IterationDecision,_const_char_(&)[17],_true>
                (in_stack_fffffffffffffe70,&in_stack_fffffffffffffe68->first,
                 (char (*) [17])in_stack_fffffffffffffe60);
      local_140 = (undefined8 *)local_70;
      local_168 = 5;
      std::
      pair<const_fizplex::Simplex::IterationDecision,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<fizplex::Simplex::IterationDecision,_const_char_(&)[11],_true>
                (in_stack_fffffffffffffe70,&in_stack_fffffffffffffe68->first,
                 (char (*) [11])in_stack_fffffffffffffe60);
      local_140 = (undefined8 *)local_48;
      local_16f._3_4_ = 6;
      std::
      pair<const_fizplex::Simplex::IterationDecision,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<fizplex::Simplex::IterationDecision,_const_char_(&)[11],_true>
                (in_stack_fffffffffffffe70,&in_stack_fffffffffffffe68->first,
                 (char (*) [11])in_stack_fffffffffffffe60);
      local_20 = local_138;
      local_18 = 7;
      in_stack_fffffffffffffe38 = (key_type *)local_16f;
      std::
      allocator<std::pair<const_fizplex::Simplex::IterationDecision,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::allocator((allocator<std::pair<const_fizplex::Simplex::IterationDecision,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)0x130da7);
      __l._M_len = (size_type)in_stack_fffffffffffffe70;
      __l._M_array = in_stack_fffffffffffffe68;
      std::
      unordered_map<fizplex::Simplex::IterationDecision,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<fizplex::Simplex::IterationDecision>,_std::equal_to<fizplex::Simplex::IterationDecision>,_std::allocator<std::pair<const_fizplex::Simplex::IterationDecision,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::unordered_map(in_stack_fffffffffffffe60,__l,in_stack_fffffffffffffe58,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe80)
      ;
      std::
      allocator<std::pair<const_fizplex::Simplex::IterationDecision,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~allocator((allocator<std::pair<const_fizplex::Simplex::IterationDecision,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)0x130de8);
      ppuVar4 = &local_20;
      do {
        ppuVar4 = ppuVar4 + -5;
        std::
        pair<const_fizplex::Simplex::IterationDecision,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair((pair<const_fizplex::Simplex::IterationDecision,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x130e13);
      } while (ppuVar4 != (undefined8 **)local_138);
      __cxa_atexit(std::
                   unordered_map<fizplex::Simplex::IterationDecision,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<fizplex::Simplex::IterationDecision>,_std::equal_to<fizplex::Simplex::IterationDecision>,_std::allocator<std::pair<const_fizplex::Simplex::IterationDecision,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::~unordered_map,
                   &operator<<(std::ostream&,fizplex::Simplex::IterationDecision_const&)::
                    idtos_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&operator<<(std::ostream&,fizplex::Simplex::IterationDecision_const&)::
                           idtos_abi_cxx11_);
    }
  }
  poVar3 = local_8;
  pmVar2 = std::
           unordered_map<fizplex::Simplex::IterationDecision,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<fizplex::Simplex::IterationDecision>,_std::equal_to<fizplex::Simplex::IterationDecision>,_std::allocator<std::pair<const_fizplex::Simplex::IterationDecision,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  std::operator<<(poVar3,(string *)pmVar2);
  return local_8;
}

Assistant:

std::ostream &operator<<(std::ostream &os,
                         const Simplex::IterationDecision &id) {
  static std::unordered_map<Simplex::IterationDecision, std::string> idtos = {
      {Simplex::IterationDecision::Unbounded, "Unbounded"},
      {Simplex::IterationDecision::BoundFlip, "BoundFlip"},
      {Simplex::IterationDecision::BaseChange, "BaseChange"},
      {Simplex::IterationDecision::OptimalSolution, "OptimalSolution"},
      {Simplex::IterationDecision::SwitchToPhaseTwo, "SwitchToPhaseTwo"},
      {Simplex::IterationDecision::Infeasible, "Infeasible"},
      {Simplex::IterationDecision::Unfinished, "Unfinished"}};
  os << idtos[id];
  return os;
}